

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  ostream *poVar7;
  char *pcVar8;
  pointer pMVar9;
  AssertionStats *pAVar10;
  bool bVar11;
  Colour colourGuard_3;
  ConsoleAssertionPrinter printer;
  Colour colourGuard_1;
  Colour colourGuard;
  char local_121;
  ostream *local_120;
  AssertionStats *local_118;
  AssertionResult *local_110;
  Code local_108;
  char *local_100;
  char *local_f8;
  char local_f0;
  undefined7 uStack_ef;
  char *local_e0;
  char *local_d8;
  char local_d0;
  undefined7 uStack_cf;
  long *local_c0 [2];
  long local_b0 [2];
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> local_a0;
  char local_88;
  undefined1 local_80 [32];
  size_t local_60;
  string local_50;
  
  pAVar10 = _assertionStats;
  iVar4 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_88 = '\x01';
  if (((char)iVar4 == '\0') &&
     (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar1 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (local_88 = '\0', OVar1 != Warning)))) {
    return false;
  }
  TablePrinter::close((this->m_tablePrinter)._M_t.
                      super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                      .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl,(int)pAVar10
                     );
  lazyPrintWithoutClosingBenchmarkTable(this);
  local_120 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  local_100 = &local_f0;
  local_108 = None;
  local_f8 = (char *)0x0;
  local_f0 = '\0';
  local_e0 = &local_d0;
  local_d8 = (char *)0x0;
  local_d0 = '\0';
  local_c0[0] = local_b0;
  pcVar2 = (_assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_118 = _assertionStats;
  local_110 = &_assertionStats->assertionResult;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,pcVar2,
             pcVar2 + (_assertionStats->assertionResult).m_resultData.message._M_string_length);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&local_a0,&_assertionStats->infoMessages);
  OVar1 = (local_110->m_resultData).resultType;
  if (ExpressionFailed < OVar1) {
    if (OVar1 < ThrewException) {
      if (OVar1 != ExplicitFailure) {
        if (OVar1 != Exception) goto LAB_0012cabd;
        goto switchD_0012c77c_caseD_ffffffff;
      }
      std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x172bce);
      local_108 = BrightRed;
      lVar5 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar5 == 0x48) {
        std::__cxx11::string::_M_replace((ulong)&local_e0,0,local_d8,0x1733dd);
        lVar5 = (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      }
      if ((ulong)((lVar5 >> 3) * -0x71c71c71c71c71c7) < 2) goto LAB_0012cabd;
      pcVar8 = "explicitly with messages";
    }
    else {
      if (OVar1 == ThrewException) {
        local_108 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x172bce);
        std::__cxx11::string::_M_replace((ulong)&local_e0,0,local_d8,0x173365);
        lVar5 = (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar5 == 0x48) {
          std::__cxx11::string::append((char *)&local_e0);
          lVar5 = (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        }
        if (1 < (ulong)((lVar5 >> 3) * -0x71c71c71c71c71c7)) {
          std::__cxx11::string::append((char *)&local_e0);
        }
        goto LAB_0012cabd;
      }
      if (OVar1 == DidntThrowException) {
        local_108 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x172bce);
        pcVar8 = "because no exception was thrown where one was expected";
      }
      else {
        if (OVar1 != FatalErrorCondition) goto LAB_0012cabd;
        local_108 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x172bce);
        pcVar8 = "due to a fatal error condition";
      }
    }
    goto LAB_0012caae;
  }
  switch(OVar1) {
  case Ok:
    local_108 = Green;
    std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x17334a);
    lVar5 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar5 == 0x48) {
      std::__cxx11::string::_M_replace((ulong)&local_e0,0,local_d8,0x1733e8);
LAB_0012c8bf:
      lVar5 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
LAB_0012c8cf:
    if ((ulong)((lVar5 >> 3) * -0x71c71c71c71c71c7) < 2) goto LAB_0012cabd;
    pcVar8 = "with messages";
    break;
  case Info:
    pcVar8 = "info";
    break;
  case Warning:
    pcVar8 = "warning";
    break;
  case Unknown:
    goto switchD_0012c77c_caseD_ffffffff;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 != ExpressionFailed) goto LAB_0012cabd;
      bVar11 = ((local_110->m_info).resultDisposition & SuppressFail) == 0;
      local_108 = Green;
      if (bVar11) {
        local_108 = BrightRed;
      }
      pcVar8 = "FAILED - but was ok";
      if (bVar11) {
        pcVar8 = "FAILED";
      }
      std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,(ulong)pcVar8);
      lVar5 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar5 == 0x48) {
        std::__cxx11::string::_M_replace((ulong)&local_e0,0,local_d8,0x1733e8);
        goto LAB_0012c8bf;
      }
      goto LAB_0012c8cf;
    }
    goto switchD_0012c77c_caseD_ffffffff;
  }
LAB_0012caae:
  std::__cxx11::string::_M_replace((ulong)&local_e0,0,local_d8,(ulong)pcVar8);
LAB_0012cabd:
  local_50._M_dataplus._M_p._0_1_ = 0;
  Colour::use(FileName);
  poVar7 = local_120;
  local_80._0_8_ = (local_110->m_info).lineInfo.file;
  local_80._8_8_ = (local_110->m_info).lineInfo.line;
  operator<<(local_120,(SourceLineInfo *)local_80);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,": ",2);
  Colour::use(None);
  if ((local_118->totals).assertions.failed + (local_118->totals).assertions.passed +
      (local_118->totals).assertions.failedButOk == 0) {
    local_80[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_120,local_80,1);
  }
  else {
    if (local_f8 != (char *)0x0) {
      local_80._0_8_ = (ulong)(uint7)local_80._1_7_ << 8;
      Colour::use(local_108);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_120,local_100,(long)local_f8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":\n",2);
      Colour::use(None);
    }
    if ((local_110->m_info).capturedExpression.m_size != 0) {
      local_50._M_dataplus._M_p._0_1_ = 0;
      Colour::use(Cyan);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_120,"  ",2);
      poVar7 = local_120;
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)local_80,local_110);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar7,(char *)local_80._0_8_,local_80._8_8_);
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
      local_80[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_120,local_80,1);
      Colour::use(None);
    }
    bVar11 = AssertionResult::hasExpandedExpression(local_110);
    if (bVar11) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_120,"with expansion:\n",0x10);
      Colour::use(BrightYellow);
      poVar7 = local_120;
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_50,local_110);
      clara::TextFlow::Column::Column((Column *)local_80,&local_50);
      local_60 = 2;
      poVar7 = clara::TextFlow::operator<<(poVar7,(Column *)local_80);
      local_121 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,&local_121,1);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
                        local_50.field_2._M_allocated_capacity + 1);
      }
      Colour::use(None);
    }
  }
  if (local_d8 != (char *)0x0) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_120,local_e0,(long)local_d8);
    local_80[0] = ':';
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_80,1);
    local_80[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_80,1);
  }
  if (local_a0.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a0.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar9 = local_a0.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      poVar7 = local_120;
      if ((local_88 != '\0') || (pMVar9->type != Info)) {
        clara::TextFlow::Column::Column((Column *)local_80,&pMVar9->message);
        local_60 = 2;
        poVar7 = clara::TextFlow::operator<<(poVar7,(Column *)local_80);
        local_50._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,(char *)&local_50,1);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_80);
      }
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != local_a0.
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  poVar7 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  cVar3 = (char)poVar7;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&local_a0);
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  return true;
switchD_0012c77c_caseD_ffffffff:
  std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x173234);
  local_108 = BrightRed;
  goto LAB_0012cabd;
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    if (!includeResults && result.getResultType() != ResultWas::Warning)
        return false;

    lazyPrint();

    ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
    printer.print();
    stream << std::endl;
    return true;
}